

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

bool __thiscall wasm::WATParser::anon_unknown_11::ParseInput::takeRParen(ParseInput *this)

{
  bool bVar1;
  Token *this_00;
  undefined1 local_60 [8];
  optional<wasm::WATParser::Token> t;
  ParseInput *this_local;
  
  t.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
  super__Optional_payload_base<wasm::WATParser::Token>._64_8_ = this;
  peek((optional<wasm::WATParser::Token> *)local_60,this);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_60);
  if (bVar1) {
    this_00 = std::optional<wasm::WATParser::Token>::operator->
                        ((optional<wasm::WATParser::Token> *)local_60);
    bVar1 = Token::isRParen(this_00);
    if (bVar1) {
      Lexer::operator++(&this->lexer);
      this_local._7_1_ = true;
      goto LAB_01d25ab0;
    }
  }
  this_local._7_1_ = false;
LAB_01d25ab0:
  std::optional<wasm::WATParser::Token>::~optional((optional<wasm::WATParser::Token> *)local_60);
  return this_local._7_1_;
}

Assistant:

bool takeRParen() {
    auto t = peek();
    if (!t || !t->isRParen()) {
      return false;
    }
    ++lexer;
    return true;
  }